

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

string * __thiscall
proto2_unittest::TestAllTypes::release_optional_string_abi_cxx11_(TestAllTypes *this)

{
  uint32_t *puVar1;
  string *released;
  TestAllTypes *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) == 0) {
    this_local = (TestAllTypes *)0x0;
  }
  else {
    puVar1 = google::protobuf::internal::HasBits<2>::operator[]
                       (&(this->field_0)._impl_._has_bits_,0);
    *puVar1 = *puVar1 & 0xfffffffe;
    this_local = (TestAllTypes *)
                 google::protobuf::internal::ArenaStringPtr::Release_abi_cxx11_
                           (&(this->field_0)._impl_.optional_string_);
  }
  return (string *)this_local;
}

Assistant:

TestAllTypes::release_optional_string() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  // @@protoc_insertion_point(field_release:proto2_unittest.TestAllTypes.optional_string)
  if ((_impl_._has_bits_[0] & 0x00000001u) == 0) {
    return nullptr;
  }
  _impl_._has_bits_[0] &= ~0x00000001u;
  auto* released = _impl_.optional_string_.Release();
  if (::google::protobuf::internal::DebugHardenForceCopyDefaultString()) {
    _impl_.optional_string_.Set("", GetArena());
  }
  return released;
}